

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O3

void __thiscall OpenMD::FragmentStamp::checkCutoffGroups(FragmentStamp *this)

{
  iterator __position;
  pointer pcVar1;
  pointer ppAVar2;
  pointer ppCVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  ostream *poVar6;
  OpenMDException *this_00;
  pointer ppAVar7;
  _Iter_equals_val<const_int> __pred;
  ulong uVar8;
  vector<int,_std::allocator<int>_> cutoffGroupAtoms;
  ostringstream oss;
  vector<int,_std::allocator<int>_> local_1e0;
  string local_1c8;
  int local_1a8 [2];
  long local_1a0;
  
  ppAVar7 = (this->atomStamps_).
            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar2 = (this->atomStamps_).
            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar7 != ppAVar2) {
    do {
      local_1a8[0] = (*ppAVar7)->index_;
      __position._M_current =
           (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->freeAtoms_,__position,local_1a8);
        ppAVar2 = (this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = local_1a8[0];
        (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      ppAVar7 = ppAVar7 + 1;
    } while (ppAVar7 != ppAVar2);
  }
  ppCVar3 = (this->cutoffGroupStamps_).
            super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->cutoffGroupStamps_).
      super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar3) {
    uVar8 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_1e0,&ppCVar3[(int)uVar8]->members_);
      local_1a0 = ((long)(this->atomStamps_).
                         super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->atomStamps_).
                         super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) + -1;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                        (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_1a8);
      if (_Var4._M_current !=
          local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar1 = (this->Name).data_._M_dataplus._M_p;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                            local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": cutoffGroup",0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," is out of range\n",0x11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(this_00,&local_1c8);
        __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != _Var4._M_current) {
        _Var4._M_current =
             (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        __pred._M_value =
             local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
        do {
          _Var5 = std::
                  __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start,_Var4,__pred);
          _Var4._M_current =
               (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (_Var5._M_current != _Var4._M_current) {
            (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = _Var5._M_current;
            _Var4 = _Var5;
          }
          __pred._M_value = __pred._M_value + 1;
        } while (__pred._M_value !=
                 local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar8 = uVar8 + 1;
      ppCVar3 = (this->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->cutoffGroupStamps_).
                                   super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void FragmentStamp::checkCutoffGroups() {
    std::vector<AtomStamp*>::iterator ai;
    std::vector<int>::iterator fai;

    // add all atoms into freeAtoms_ set
    for (ai = atomStamps_.begin(); ai != atomStamps_.end(); ++ai) {
      freeAtoms_.push_back((*ai)->getIndex());
    }

    for (std::size_t i = 0; i < getNCutoffGroups(); ++i) {
      CutoffGroupStamp* cutoffGroupStamp = getCutoffGroupStamp(i);
      std::vector<int> cutoffGroupAtoms  = cutoffGroupStamp->getMembers();
      std::vector<int>::iterator j       = std::find_if(
          cutoffGroupAtoms.begin(), cutoffGroupAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      if (j != cutoffGroupAtoms.end()) {
        std::ostringstream oss;
        oss << "Error in Fragment " << getName() << ": cutoffGroup"
            << " is out of range\n";
        throw OpenMDException(oss.str());
      }

      for (fai = cutoffGroupAtoms.begin(); fai != cutoffGroupAtoms.end();
           ++fai) {
        // erase the atoms belonging to cutoff groups from freeAtoms_ vector
        freeAtoms_.erase(
            std::remove(freeAtoms_.begin(), freeAtoms_.end(), (*fai)),
            freeAtoms_.end());
      }
    }
  }